

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_AssetLimitAmountValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  Amount AVar9;
  AssertionResult gtest_ar_4;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar;
  CfdException *except;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  ConfidentialTransactionContext txc;
  Amount fee;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  double fee_rate;
  ElementsConfidentialAddress reserve_ct_addr4;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ExtPubkey key;
  Address address4;
  Address address3;
  Address address2;
  Address address1;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  ConfidentialAssetId *in_stack_ffffffffffffbf28;
  string *tx_hex;
  UtxoData *in_stack_ffffffffffffbf30;
  UtxoData *this_00;
  undefined4 in_stack_ffffffffffffbf38;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffbf3c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffbf40;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_01;
  allocator_type *in_stack_ffffffffffffbf58;
  undefined4 in_stack_ffffffffffffbf60;
  undefined4 in_stack_ffffffffffffbf64;
  undefined4 in_stack_ffffffffffffbf68;
  undefined4 uVar11;
  NetType in_stack_ffffffffffffbf6c;
  undefined4 uVar12;
  ElementsAddressFactory *in_stack_ffffffffffffbf70;
  ConfidentialTransactionContext *this_02;
  UtxoData *in_stack_ffffffffffffbf90;
  undefined4 in_stack_ffffffffffffbf98;
  undefined4 in_stack_ffffffffffffbf9c;
  UtxoData *in_stack_ffffffffffffbfa0;
  ConfidentialAssetId *in_stack_ffffffffffffbfd8;
  undefined4 in_stack_ffffffffffffbfe0;
  undefined1 in_stack_ffffffffffffbfe4;
  undefined1 in_stack_ffffffffffffbfe6;
  undefined8 in_stack_ffffffffffffc000;
  allocator *paVar13;
  ConfidentialAssetId *in_stack_ffffffffffffc008;
  undefined2 in_stack_ffffffffffffc010;
  undefined1 in_stack_ffffffffffffc012;
  undefined1 in_stack_ffffffffffffc013;
  undefined1 in_stack_ffffffffffffc014;
  undefined1 in_stack_ffffffffffffc015;
  undefined1 in_stack_ffffffffffffc016;
  undefined1 in_stack_ffffffffffffc017;
  ElementsConfidentialAddress *in_stack_ffffffffffffc018;
  ConfidentialTransactionContext *in_stack_ffffffffffffc020;
  undefined1 ***local_3f28;
  AssertHelper local_3ea8;
  Message local_3ea0;
  undefined4 local_3e94;
  AssertionResult local_3e90;
  uint local_3e7c;
  AssertHelper local_3e78;
  Message local_3e70;
  undefined4 local_3e68;
  uint32_t local_3e64;
  AssertionResult local_3e60;
  AssertHelper local_3e50;
  Message local_3e48;
  string local_3e40;
  AssertionResult local_3e20;
  AssertHelper local_3e10;
  Message local_3e08;
  int64_t local_3e00;
  int64_t local_3df8;
  undefined1 local_3df0;
  Amount local_3de8;
  int64_t local_3dd8;
  AssertionResult local_3dd0;
  AssertHelper local_3dc0;
  Message local_3db8 [4];
  AssertHelper local_3d98;
  Message local_3d90 [4];
  CoinSelectionOption *in_stack_ffffffffffffc290;
  AssertHelper local_3d60;
  Message local_3d58;
  SigHashType local_3d50;
  allocator local_3d41;
  string local_3d40;
  Privkey local_3d20;
  allocator local_3cf9;
  string local_3cf8;
  Pubkey local_3cd8;
  OutPoint local_3cc0;
  AssertHelper local_3c98;
  Message local_3c90 [5];
  byte local_3c61;
  ConstCharPtr local_3c60;
  AssertHelper local_3c58;
  Message local_3c50;
  OutPoint local_3c48;
  AssertHelper local_3c20;
  Message local_3c18;
  SigHashType local_3c10;
  allocator local_3c01;
  string local_3c00;
  Privkey local_3be0;
  allocator local_3bb9;
  string local_3bb8;
  Pubkey local_3b98;
  OutPoint local_3b80;
  AssertHelper local_3b58;
  Message local_3b50 [3];
  OutPoint *in_stack_ffffffffffffc4c8;
  ConfidentialTransactionContext *in_stack_ffffffffffffc4d0;
  byte in_stack_ffffffffffffc4df;
  char *in_stack_ffffffffffffc4e0;
  AssertHelper in_stack_ffffffffffffc4e8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffc4f0;
  OutPoint *in_stack_ffffffffffffc4f8;
  ConfidentialTransactionContext *in_stack_ffffffffffffc500;
  AssertHelper local_3ae0;
  Message local_3ad8;
  SigHashType local_3ad0;
  allocator local_3ac1;
  string local_3ac0;
  Privkey local_3aa0;
  allocator local_3a79;
  string local_3a78;
  Pubkey local_3a58 [2];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffc5d8;
  ConfidentialTransactionContext *in_stack_ffffffffffffc5e0;
  ByteData local_3a18;
  AssertHelper local_3a00;
  Message local_39f8 [7];
  string local_39c0 [216];
  string local_38e8 [3];
  ElementsTransactionApi local_3871;
  Amount local_3870;
  int64_t local_3860;
  undefined1 local_3858;
  int64_t local_3850;
  undefined1 local_3848;
  ConfidentialTransaction local_3840 [2];
  Amount local_3788;
  CoinSelectionOption local_3778;
  char local_36f4 [4];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_36f0;
  _Base_ptr local_36c8;
  undefined1 local_36c0;
  string local_36b8;
  string local_3698;
  _Base_ptr local_3678;
  undefined1 local_3670;
  string local_3668;
  string local_3648;
  string local_3628;
  _Base_ptr local_35f8;
  undefined1 local_35f0;
  Amount local_35e8;
  string local_35d8;
  _Base_ptr local_35b8;
  undefined1 local_35b0;
  Amount local_35a8;
  string local_3598 [2];
  undefined1 local_3548 [160];
  Pubkey local_34a8;
  ElementsConfidentialAddress local_3490;
  ExtPubkey local_32e0;
  Pubkey local_3270;
  ElementsConfidentialAddress local_3258;
  ExtPubkey local_30a8;
  Pubkey local_3038;
  ElementsConfidentialAddress local_3020;
  ExtPubkey local_2e70;
  Pubkey local_2e00 [3];
  double in_stack_ffffffffffffd250;
  undefined1 in_stack_ffffffffffffd25f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffd260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffd268;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd270;
  string *in_stack_ffffffffffffd278;
  ElementsTransactionApi *in_stack_ffffffffffffd280;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffd2a0;
  ConfidentialAssetId *in_stack_ffffffffffffd2a8;
  Amount *in_stack_ffffffffffffd2b8;
  UtxoFilter *in_stack_ffffffffffffd2c0;
  CoinSelectionOption *in_stack_ffffffffffffd2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd2d0;
  NetType_conflict in_stack_ffffffffffffd2d8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffd2e0;
  Amount *in_stack_ffffffffffffd2e8;
  undefined1 **local_2c28 [474];
  undefined8 **local_1d58;
  undefined8 local_1d50;
  allocator local_1d29;
  string local_1d28;
  ExtPubkey local_1d08;
  allocator local_1c91;
  string local_1c90 [32];
  Address local_1c70;
  allocator local_1af1;
  string local_1af0 [32];
  Address local_1ad0;
  allocator local_1951;
  string local_1950 [32];
  Address local_1930;
  allocator local_17b1;
  string local_17b0 [32];
  Address local_1790;
  Amount local_1618;
  allocator local_1601;
  string local_1600 [32];
  Address local_15e0;
  allocator local_1461;
  string local_1460;
  Script local_1440;
  allocator local_1401;
  string local_1400;
  Txid local_13e0;
  undefined8 local_13c0;
  Txid local_1398;
  uint32_t local_1378;
  Script local_1370 [2];
  Address local_1300;
  string local_1188 [32];
  Amount local_1168;
  undefined4 local_1158;
  undefined8 local_1150;
  ConfidentialAssetId local_1148 [15];
  Amount local_ed0;
  allocator local_eb9;
  string local_eb8 [32];
  Address local_e98;
  allocator local_d19;
  string local_d18;
  Script local_cf8;
  allocator local_cb9;
  string local_cb8;
  Txid local_c98;
  undefined8 local_c78;
  Txid local_c50;
  uint32_t local_c30;
  Script local_c28 [2];
  Address local_bb8;
  string local_a40 [32];
  int64_t local_a20;
  undefined1 local_a18;
  undefined4 local_a10;
  undefined8 local_a08;
  ConfidentialAssetId local_a00 [15];
  Amount local_788;
  allocator local_771;
  string local_770 [32];
  Address local_750;
  allocator local_5d1;
  string local_5d0;
  Script local_5b0;
  allocator local_571;
  string local_570;
  Txid local_550;
  undefined8 local_520;
  Txid local_4f8;
  uint32_t local_4d8;
  Script local_4d0 [2];
  Address local_460;
  string local_2e8 [32];
  int64_t local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [17];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffbf70,in_stack_ffffffffffffbf6c);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffbf90);
  local_520 = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_571);
  cfd::core::Txid::Txid(&local_550,&local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x2d5bb6);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,&local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_771);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  cfd::core::Address::operator=(&local_460,&local_750);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_788,2000000000000000);
  local_2c0 = local_788.ignore_check_;
  local_2c8 = local_788.amount_;
  local_2b8 = 2;
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffbf90);
  local_c78 = 0;
  local_a08 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_cb8,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_cb9);
  cfd::core::Txid::Txid(&local_c98,&local_cb8);
  cfd::core::Txid::operator=(&local_c50,&local_c98);
  cfd::core::Txid::~Txid((Txid *)0x2d5df6);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cb9);
  local_c30 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d18,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d19);
  cfd::core::Script::Script(&local_cf8,&local_d18);
  cfd::core::Script::operator=(local_c28,&local_cf8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string((string *)&local_d18);
  std::allocator<char>::~allocator((allocator<char> *)&local_d19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_eb8,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_eb9);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  cfd::core::Address::operator=(&local_bb8,&local_e98);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_eb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_eb9);
  std::__cxx11::string::operator=
            (local_a40,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_ed0,2000000000000000);
  local_a18 = local_ed0.ignore_check_;
  local_a20 = local_ed0.amount_;
  local_a10 = 6;
  cfd::core::ConfidentialAssetId::operator=(local_a00,&exp_dummy_asset_b);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffbf90);
  local_13c0 = 0;
  local_1150 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1400,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_1401);
  cfd::core::Txid::Txid(&local_13e0,&local_1400);
  cfd::core::Txid::operator=(&local_1398,&local_13e0);
  cfd::core::Txid::~Txid((Txid *)0x2d6036);
  std::__cxx11::string::~string((string *)&local_1400);
  std::allocator<char>::~allocator((allocator<char> *)&local_1401);
  local_1378 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1460,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1461);
  cfd::core::Script::Script(&local_1440,&local_1460);
  cfd::core::Script::operator=(local_1370,&local_1440);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string((string *)&local_1460);
  std::allocator<char>::~allocator((allocator<char> *)&local_1461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1600,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1601)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  cfd::core::Address::operator=(&local_1300,&local_15e0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_1600);
  std::allocator<char>::~allocator((allocator<char> *)&local_1601);
  std::__cxx11::string::operator=
            (local_1188,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_1618,50000000000000);
  local_1168.ignore_check_ = local_1618.ignore_check_;
  local_1168.amount_ = local_1618.amount_;
  local_1158 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_1148,&exp_dummy_asset_a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_17b0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_17b1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_17b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_17b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1950,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",&local_1951)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_1950);
  std::allocator<char>::~allocator((allocator<char> *)&local_1951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1af0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1af1)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_1af0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1af1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c90,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",&local_1c91)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
             (string *)in_stack_ffffffffffffbf30);
  std::__cxx11::string::~string(local_1c90);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d28,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_1d29);
  cfd::core::ExtPubkey::ExtPubkey(&local_1d08,&local_1d28);
  std::__cxx11::string::~string((string *)&local_1d28);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d29);
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffbfa0,
             (UtxoData *)CONCAT44(in_stack_ffffffffffffbf9c,in_stack_ffffffffffffbf98));
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffbfa0,
             (UtxoData *)CONCAT44(in_stack_ffffffffffffbf9c,in_stack_ffffffffffffbf98));
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffbfa0,
             (UtxoData *)CONCAT44(in_stack_ffffffffffffbf9c,in_stack_ffffffffffffbf98));
  local_1d58 = local_2c28;
  local_1d50 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2d6483);
  __l._M_array._4_4_ = in_stack_ffffffffffffbf6c;
  __l._M_array._0_4_ = in_stack_ffffffffffffbf68;
  __l._M_len = (size_type)in_stack_ffffffffffffbf70;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffbf64,in_stack_ffffffffffffbf60),__l,
             in_stack_ffffffffffffbf58);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2d64b7);
  local_3f28 = (undefined1 ***)&local_1d58;
  do {
    local_3f28 = local_3f28 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffbf30);
    uVar2 = (undefined1)((ulong)in_stack_ffffffffffffc000 >> 0x38);
  } while (local_3f28 != local_2c28);
  cfd::core::ExtPubkey::DerivePubkey(&local_2e70,&local_1d08,0x5b);
  cfd::core::ExtPubkey::GetPubkey(local_2e00,&local_2e70);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(local_2e00 + 1),&local_1790,local_2e00);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d656d);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffbf30);
  cfd::core::ExtPubkey::DerivePubkey(&local_30a8,&local_1d08,0x5c);
  cfd::core::ExtPubkey::GetPubkey(&local_3038,&local_30a8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_3020,&local_1930,&local_3038);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d65d9);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffbf30);
  cfd::core::ExtPubkey::DerivePubkey(&local_32e0,&local_1d08,0x5d);
  cfd::core::ExtPubkey::GetPubkey(&local_3270,&local_32e0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_3258,&local_1ad0,&local_3270);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d6645);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffbf30);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)(local_3548 + 0x30),&local_1d08,0x5e);
  cfd::core::ExtPubkey::GetPubkey(&local_34a8,(ExtPubkey *)(local_3548 + 0x30));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_3490,&local_1c70,&local_34a8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d66b1);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)in_stack_ffffffffffffbf30);
  local_3548._40_8_ = (_func_int **)0x3fbc28f5c28f5c29;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_3548,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2d66f3);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_3598,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_35a8);
  pVar7 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffbf40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
                     (Amount *)in_stack_ffffffffffffbf30);
  local_35b8 = (_Base_ptr)pVar7.first._M_node;
  local_35b0 = pVar7.second;
  std::__cxx11::string::~string((string *)local_3598);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_35d8,&exp_dummy_asset_b);
  cfd::core::Amount::Amount(&local_35e8);
  pVar7 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffbf40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
                     (Amount *)in_stack_ffffffffffffbf30);
  local_35f8 = (_Base_ptr)pVar7.first._M_node;
  local_35f0 = pVar7.second;
  std::__cxx11::string::~string((string *)&local_35d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2d67fc);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3648,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_3668,&local_3258);
  pVar8 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_ffffffffffffbf40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbf30);
  local_3678 = (_Base_ptr)pVar8.first._M_node;
  local_3670 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_3668);
  std::__cxx11::string::~string((string *)&local_3648);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3698,&exp_dummy_asset_b);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_36b8,&local_3490);
  pVar8 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_ffffffffffffbf40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffbf3c,in_stack_ffffffffffffbf38),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffbf30);
  local_36c8 = (_Base_ptr)pVar8.first._M_node;
  local_36c0 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_36b8);
  std::__cxx11::string::~string((string *)&local_3698);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2d692f);
  cfd::core::Amount::Amount((Amount *)&local_36f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2d694b);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffbf30);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffc290);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffbf30,(double)in_stack_ffffffffffffbf28);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffbf30,(double)in_stack_ffffffffffffbf28);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffbf30,in_stack_ffffffffffffbf28);
  cfd::CoinSelectionOption::SetBlindInfo(&local_3778,0,0x34);
  cfd::core::Amount::Amount(&local_3788,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffbf30,
             (uint32_t)((ulong)in_stack_ffffffffffffbf28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffbf28);
  AVar9 = cfd::core::operator-(&local_1168,&local_3788);
  local_3860 = AVar9.amount_;
  local_3858 = AVar9.ignore_check_;
  local_3850 = local_3860;
  local_3848 = local_3858;
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffc020,in_stack_ffffffffffffc018,
             (Amount *)
             CONCAT17(in_stack_ffffffffffffc017,
                      CONCAT16(in_stack_ffffffffffffc016,
                               CONCAT15(in_stack_ffffffffffffc015,
                                        CONCAT14(in_stack_ffffffffffffc014,
                                                 CONCAT13(in_stack_ffffffffffffc013,
                                                          CONCAT12(in_stack_ffffffffffffc012,
                                                                   in_stack_ffffffffffffc010)))))),
             in_stack_ffffffffffffc008,(bool)uVar2);
  cfd::core::Amount::Amount(&local_3870,2100000000000000);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffc020,in_stack_ffffffffffffc018,
             (Amount *)
             CONCAT17(in_stack_ffffffffffffc017,
                      CONCAT16(in_stack_ffffffffffffc016,
                               CONCAT15(in_stack_ffffffffffffc015,
                                        CONCAT14(in_stack_ffffffffffffc014,
                                                 CONCAT13(in_stack_ffffffffffffc013,
                                                          CONCAT12(in_stack_ffffffffffffc012,
                                                                   in_stack_ffffffffffffc010)))))),
             in_stack_ffffffffffffc008,(bool)uVar2);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_3871);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_38e8,&local_3840[0].super_AbstractTransaction);
  pcVar6 = local_36f4;
  this_01 = &local_36f0;
  this_00 = (UtxoData *)local_3548;
  tx_hex = &local_3628;
  this_02 = (ConfidentialTransactionContext *)0x0;
  uVar11 = 0;
  uVar12 = 0;
  uVar10 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffd280,in_stack_ffffffffffffd278,in_stack_ffffffffffffd270,
             in_stack_ffffffffffffd268,in_stack_ffffffffffffd260,in_stack_ffffffffffffd2a0,
             in_stack_ffffffffffffd2a8,(bool)in_stack_ffffffffffffd25f,in_stack_ffffffffffffd250,
             in_stack_ffffffffffffd2b8,in_stack_ffffffffffffd2c0,in_stack_ffffffffffffd2c8,
             in_stack_ffffffffffffd2d0,in_stack_ffffffffffffd2d8,in_stack_ffffffffffffd2e0,
             in_stack_ffffffffffffd2e8);
  std::__cxx11::string::~string((string *)local_38e8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)tx_hex);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00,tx_hex);
  cfd::ConfidentialTransactionContext::operator=
            (this_02,(ConfidentialTransactionContext *)CONCAT44(uVar12,uVar11));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  std::__cxx11::string::~string(local_39c0);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_00);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8);
    }
  }
  else {
    testing::Message::Message(local_39f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4b9,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a00,local_39f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a00);
    testing::Message::~Message((Message *)0x2d7958);
  }
  cfd::core::ByteData::ByteData(&local_3a18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)(local_3a58 + 1),&local_4f8,local_4d8);
      paVar13 = &local_3a79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3a78,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar13);
      cfd::core::Pubkey::Pubkey(local_3a58,&local_3a78);
      paVar13 = &local_3ac1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3ac0,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 paVar13);
      cfd::core::Privkey::FromWif(&local_3aa0,&local_3ac0,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_3ad0);
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc500,in_stack_ffffffffffffc4f8,
                 (Pubkey *)in_stack_ffffffffffffc4f0.ptr_,(Privkey *)in_stack_ffffffffffffc4e8.data_
                 ,(SigHashType *)in_stack_ffffffffffffc4e0,(bool)in_stack_ffffffffffffc4df);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d7af8);
      std::__cxx11::string::~string((string *)&local_3ac0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ac1);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d7b1f);
      std::__cxx11::string::~string((string *)&local_3a78);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a79);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d7b46);
    }
  }
  else {
    testing::Message::Message(&local_3ad8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3ae0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c0,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3ae0,&local_3ad8);
    testing::internal::AssertHelper::~AssertHelper(&local_3ae0);
    testing::Message::~Message((Message *)0x2d7cd8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)&stack0xffffffffffffc4f8,&local_4f8,local_4d8);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d7da1);
    }
  }
  else {
    testing::Message::Message((Message *)&stack0xffffffffffffc4f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffc4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c1,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffc4e8,(Message *)&stack0xffffffffffffc4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffc4e8);
    testing::Message::~Message((Message *)0x2d7e6b);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffc4e0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffc4e0);
  if (bVar1) {
    in_stack_ffffffffffffc4df = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10));
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d7f51);
    }
    if ((in_stack_ffffffffffffc4df & 1) == 0) {
      in_stack_ffffffffffffc4e0 =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002d7ff4;
    }
  }
  else {
LAB_002d7ff4:
    testing::Message::Message(local_3b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c2,in_stack_ffffffffffffc4e0);
    testing::internal::AssertHelper::operator=(&local_3b58,local_3b50);
    testing::internal::AssertHelper::~AssertHelper(&local_3b58);
    testing::Message::~Message((Message *)0x2d805c);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3b80,&local_c50,local_c30);
      paVar13 = &local_3bb9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3bb8,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar13);
      cfd::core::Pubkey::Pubkey(&local_3b98,&local_3bb8);
      paVar13 = &local_3c01;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3c00,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 paVar13);
      cfd::core::Privkey::FromWif(&local_3be0,&local_3c00,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_3c10);
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc500,in_stack_ffffffffffffc4f8,
                 (Pubkey *)in_stack_ffffffffffffc4f0.ptr_,(Privkey *)in_stack_ffffffffffffc4e8.data_
                 ,(SigHashType *)in_stack_ffffffffffffc4e0,(bool)in_stack_ffffffffffffc4df);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d81ed);
      std::__cxx11::string::~string((string *)&local_3c00);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c01);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d8214);
      std::__cxx11::string::~string((string *)&local_3bb8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3bb9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d823b);
    }
  }
  else {
    testing::Message::Message(&local_3c18);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c7,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3c20,&local_3c18);
    testing::internal::AssertHelper::~AssertHelper(&local_3c20);
    testing::Message::~Message((Message *)0x2d83b4);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3c48,&local_c50,local_c30);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d847d);
    }
  }
  else {
    testing::Message::Message(&local_3c50);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4c8,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3c58,&local_3c50);
    testing::internal::AssertHelper::~AssertHelper(&local_3c58);
    testing::Message::~Message((Message *)0x2d8547);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3c60,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3c60);
  if (bVar1) {
    local_3c61 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10));
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d862d);
    }
    if ((local_3c61 & 1) != 0) goto LAB_002d8783;
    local_3c60.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3c90);
  testing::internal::AssertHelper::AssertHelper
            (&local_3c98,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x4c9,local_3c60.value);
  testing::internal::AssertHelper::operator=(&local_3c98,local_3c90);
  testing::internal::AssertHelper::~AssertHelper(&local_3c98);
  testing::Message::~Message((Message *)0x2d8738);
LAB_002d8783:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3cc0,&local_1398,local_1378);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3cf8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_3cf9);
      cfd::core::Pubkey::Pubkey(&local_3cd8,&local_3cf8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3d40,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 &local_3d41);
      cfd::core::Privkey::FromWif(&local_3d20,&local_3d40,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_3d50);
      cfd::ConfidentialTransactionContext::SignWithKey
                (in_stack_ffffffffffffc500,in_stack_ffffffffffffc4f8,
                 (Pubkey *)in_stack_ffffffffffffc4f0.ptr_,(Privkey *)in_stack_ffffffffffffc4e8.data_
                 ,(SigHashType *)in_stack_ffffffffffffc4e0,(bool)in_stack_ffffffffffffc4df);
      cfd::core::Privkey::~Privkey((Privkey *)0x2d88c9);
      std::__cxx11::string::~string((string *)&local_3d40);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d41);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d88f0);
      std::__cxx11::string::~string((string *)&local_3cf8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3cf9);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d8917);
    }
  }
  else {
    testing::Message::Message(&local_3d58);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4ce,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3d60,&local_3d58);
    testing::internal::AssertHelper::~AssertHelper(&local_3d60);
    testing::Message::~Message((Message *)0x2d8a90);
  }
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_ffffffffffffbfe6 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffbfe6) {
      cfd::core::OutPoint::OutPoint((OutPoint *)(local_3d90 + 1),&local_1398,local_1378);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc4d0,in_stack_ffffffffffffc4c8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2d8b59);
    }
  }
  else {
    testing::Message::Message(local_3d90);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4cf,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3d98,local_3d90);
    testing::internal::AssertHelper::~AssertHelper(&local_3d98);
    testing::Message::~Message((Message *)0x2d8c23);
  }
  uVar3 = testing::internal::AlwaysTrue();
  if ((bool)uVar3) {
    in_stack_ffffffffffffbfe4 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffbfe4) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10));
      cfd::core::ByteData::operator=((ByteData *)this_00,(ByteData *)tx_hex);
      cfd::core::ByteData::~ByteData((ByteData *)0x2d8ce0);
    }
  }
  else {
    testing::Message::Message(local_3db8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3dc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d1,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_3dc0,local_3db8);
    testing::internal::AssertHelper::~AssertHelper(&local_3dc0);
    testing::Message::~Message((Message *)0x2d8d87);
  }
  AVar9 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)
                     CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffbfe6,
                                             CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffbfe4,
                                                                     in_stack_ffffffffffffbfe0)))),
                     in_stack_ffffffffffffbfd8);
  local_3df8 = AVar9.amount_;
  local_3df0 = AVar9.ignore_check_;
  local_3de8.amount_ = local_3df8;
  local_3de8.ignore_check_ = (bool)local_3df0;
  local_3dd8 = cfd::core::Amount::GetSatoshiValue(&local_3de8);
  local_3e00 = cfd::core::Amount::GetSatoshiValue((Amount *)&local_36f0);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar6,(char *)this_01,(long *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10),
             (long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3dd0);
  if (!bVar1) {
    testing::Message::Message(&local_3e08);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d8f08);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e10,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e10,&local_3e08);
    testing::internal::AssertHelper::~AssertHelper(&local_3e10);
    testing::Message::~Message((Message *)0x2d8f6b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d8fc3);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3e40,&local_3a18);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3e20,"tx.GetHex().c_str()",
             "\"020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000\""
             ,pcVar5,
             "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000"
            );
  std::__cxx11::string::~string((string *)&local_3e40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e20);
  if (!bVar1) {
    testing::Message::Message(&local_3e48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d90b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e50,&local_3e48);
    testing::internal::AssertHelper::~AssertHelper(&local_3e50);
    testing::Message::~Message((Message *)0x2d910d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d9165);
  local_3e64 = cfd::core::ConfidentialTransaction::GetVsize(local_3840);
  local_3e68 = 0x2f9;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_01,(uint *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e60);
  if (!bVar1) {
    testing::Message::Message(&local_3e70);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2d9224);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e78,&local_3e70);
    testing::internal::AssertHelper::~AssertHelper(&local_3e78);
    testing::Message::~Message((Message *)0x2d9281);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d92d9);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize(local_3840);
  local_3e7c = (uVar4 * (int)(long)((double)local_3548._40_8_ * 100.0)) / 100;
  local_3e94 = 0x53;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_01,(uint *)CONCAT44(in_stack_ffffffffffffbf3c,uVar10),
             (int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e90);
  if (!bVar1) {
    testing::Message::Message(&local_3ea0);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2d93c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x4d7,pcVar6);
    testing::internal::AssertHelper::operator=(&local_3ea8,&local_3ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_3ea8);
    testing::Message::~Message((Message *)0x2d941d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2d9475);
  cfd::core::ByteData::~ByteData((ByteData *)0x2d9482);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_00);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2d949c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2d94c3);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2d94d0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2d94dd);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_00);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_00);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_00);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_00);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_01);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::core::Address::~Address((Address *)this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::UtxoData::~UtxoData(this_00);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2d9593);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_AssetLimitAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{2000000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_b;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{2000000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_b;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{50000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  Address address4 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr4 = ElementsConfidentialAddress(
      address4, key.DerivePubkey(94).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount());
  map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount());
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), reserve_ct_addr4.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, Amount(int64_t{2100000000000000}), exp_dummy_asset_b);

  try {
    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);
    txc = ConfidentialTransactionContext(ctx.GetHex());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402200ab5855d6f2aacba3c02bf7e7d7feb5ac07f0dd1081f645b26d7c3761a6586dc02206ade8c8d928f3deefa3ca205b25fa6368a4cf90277196f24a2be3c21b867f78101210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffffe3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffff050100000000000000000000000000000000000000000000000000000000000000aa0100002d79883cf8f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000bb01000775f05a07400002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa01000000000000023900000100000000000000000000000000000000000000000000000000000000000000bb010006c00a3912c000033b8298639bbce61dddf46d9d9d257e6ab497314075555f2029c5b9ab4a3ad9c716001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000024d7029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e400000000000002473044022003c51f2fb5cd560550759c1652ca962a6644e54bfef8adf675d1e3e3791b7a5d02204640a7d3abbc4e31668b59178b35b2cb0bad8abe5f1dfb474db3d40295e07db301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b0000000000000002473044022033cf5cb157f8932d77683fd55ee70b21fc41b715f0f82d746dbc254e1c114ec60220355b6c0170c55da3b7d4c2c6b5fbd62da8a839c18798f06b7c29e39808b1ec5601210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a270000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 761);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 83);
}